

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

void __thiscall
Lowerer::LowerInlineSpreadArgOutLoopUsingRegisters
          (Lowerer *this,Instr *callInstr,RegOpnd *indexOpnd,RegOpnd *arrayElementsStartOpnd)

{
  Func *func;
  BYTE scale;
  LabelInstr *target;
  IntConstOpnd *pIVar1;
  LabelInstr *this_00;
  Loop *pLVar2;
  IndirOpnd *src;
  Instr *pIVar3;
  RegOpnd *dst;
  Lowerer *pLVar4;
  LowererMDArch *this_01;
  
  func = callInstr->m_func;
  target = IR::LabelInstr::New(Label,func,false);
  pLVar4 = (Lowerer *)&DAT_00000001;
  pIVar1 = IR::IntConstOpnd::New(1,TyUint8,func,false);
  InsertCompareBranch(pLVar4,&indexOpnd->super_Opnd,&pIVar1->super_Opnd,BrEq_A,true,target,callInstr
                      ,false);
  this_00 = InsertLoopTopLabel(this,callInstr);
  pLVar2 = IR::LabelInstr::GetLoop(this_00);
  BVSparse<Memory::JitArenaAllocator>::Set
            ((pLVar2->regAlloc).liveOnBackEdgeSyms,(indexOpnd->m_sym->super_Sym).m_id);
  BVSparse<Memory::JitArenaAllocator>::Set
            ((pLVar2->regAlloc).liveOnBackEdgeSyms,(arrayElementsStartOpnd->m_sym->super_Sym).m_id);
  pIVar1 = IR::IntConstOpnd::New(1,TyInt8,func,false);
  InsertSub(false,&indexOpnd->super_Opnd,&indexOpnd->super_Opnd,&pIVar1->super_Opnd,callInstr);
  scale = LowererMDArch::GetDefaultIndirScale();
  src = IR::IndirOpnd::New(arrayElementsStartOpnd,indexOpnd,scale,TyUint64,func);
  pIVar3 = IR::Instr::New(ArgOut_A_Dynamic,func);
  dst = IR::RegOpnd::New(TyUint64,func);
  InsertMove(&dst->super_Opnd,&src->super_Opnd,callInstr,true);
  IR::Instr::SetSrc1(pIVar3,&dst->super_Opnd);
  IR::Instr::SetSrc2(pIVar3,&indexOpnd->super_Opnd);
  IR::Instr::InsertBefore(callInstr,pIVar3);
  this_01 = &(this->m_lowererMD).lowererMDArch;
  LowererMDArch::LoadDynamicArgumentUsingLength(this_01,pIVar3);
  pLVar4 = (Lowerer *)&DAT_00000001;
  pIVar1 = IR::IntConstOpnd::New(1,TyUint8,func,false);
  InsertCompareBranch(pLVar4,&indexOpnd->super_Opnd,&pIVar1->super_Opnd,BrNeq_A,true,this_00,
                      callInstr,false);
  IR::Instr::InsertBefore(callInstr,&target->super_Instr);
  pIVar3 = IR::Instr::New(ArgOut_A_Dynamic,func);
  IR::Instr::SetSrc1(pIVar3,&src->super_Opnd);
  IR::Instr::InsertBefore(callInstr,pIVar3);
  LowererMDArch::LoadDynamicArgument(this_01,pIVar3,4);
  return;
}

Assistant:

void
Lowerer::LowerInlineSpreadArgOutLoopUsingRegisters(IR::Instr *callInstr, IR::RegOpnd *indexOpnd, IR::RegOpnd *arrayElementsStartOpnd)
{
    Func *const func = callInstr->m_func;

    IR::LabelInstr *oneArgLabel = IR::LabelInstr::New(Js::OpCode::Label, func);
    InsertCompareBranch(indexOpnd, IR::IntConstOpnd::New(1, TyUint8, func), Js::OpCode::BrEq_A, true, oneArgLabel, callInstr);

    IR::LabelInstr *startLoopLabel = InsertLoopTopLabel(callInstr);
    Loop * loop = startLoopLabel->GetLoop();
    loop->regAlloc.liveOnBackEdgeSyms->Set(indexOpnd->m_sym->m_id);
    loop->regAlloc.liveOnBackEdgeSyms->Set(arrayElementsStartOpnd->m_sym->m_id);
    InsertSub(false, indexOpnd, indexOpnd, IR::IntConstOpnd::New(1, TyInt8, func), callInstr);

    IR::IndirOpnd *elemPtrOpnd = IR::IndirOpnd::New(arrayElementsStartOpnd, indexOpnd, this->m_lowererMD.GetDefaultIndirScale(), TyMachPtr, func);

    // Generate argout for n+2 arg (skipping function object + this)
    IR::Instr *argout = IR::Instr::New(Js::OpCode::ArgOut_A_Dynamic, func);

    // X64 requires a reg opnd
    IR::RegOpnd *elemRegOpnd = IR::RegOpnd::New(TyMachPtr, func);
    Lowerer::InsertMove(elemRegOpnd, elemPtrOpnd, callInstr);
    argout->SetSrc1(elemRegOpnd);
    argout->SetSrc2(indexOpnd);
    callInstr->InsertBefore(argout);
    this->m_lowererMD.LoadDynamicArgumentUsingLength(argout);

    InsertCompareBranch(indexOpnd, IR::IntConstOpnd::New(1, TyUint8, func), Js::OpCode::BrNeq_A, true, startLoopLabel, callInstr);

    // Emit final argument into register 4 on AMD64 and ARM
    callInstr->InsertBefore(oneArgLabel);
    argout = IR::Instr::New(Js::OpCode::ArgOut_A_Dynamic, func);
    argout->SetSrc1(elemPtrOpnd);
    callInstr->InsertBefore(argout);
    this->m_lowererMD.LoadDynamicArgument(argout, 4); //4 to denote this is 4th register after this, callinfo & function object
}